

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void flatbuffers::tests::JsonDefaultTest(string *tests_data_path)

{
  char **ppcVar1;
  pointer pcVar2;
  undefined4 off;
  undefined4 start;
  bool bVar3;
  Offset<MyGame::Example::Monster> table;
  uint8_t *flatbuffer;
  char *pcVar4;
  long lVar5;
  string jsongen;
  string schemafile;
  string include_test_path;
  char *include_directories [3];
  FlatBufferBuilder builder;
  Parser parser;
  string local_b28;
  string local_b08;
  string local_ae8;
  pointer local_ac8;
  pointer local_ac0;
  undefined8 local_ab8;
  undefined1 local_ab0 [32];
  size_type local_a90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a88;
  _Alloc_hider local_a78;
  undefined6 uStack_a70;
  undefined2 uStack_a6a;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a68;
  size_t local_a58;
  undefined2 local_a50;
  _Alloc_hider local_a48;
  undefined2 local_a40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38 [41];
  Parser local_7a0;
  
  local_b08._M_string_length = 0;
  local_b08.field_2._M_local_buf[0] = '\0';
  ppcVar1 = &local_7a0.super_ParserState.line_start_;
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_b08._M_dataplus._M_p = (pointer)&local_b08.field_2;
  local_7a0.super_ParserState.prev_cursor_ = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a0,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append((char *)&local_7a0);
  bVar3 = LoadFile(local_7a0.super_ParserState.prev_cursor_,false,&local_b08);
  TestEq<bool,bool>(bVar3,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.fbs\").c_str(), false, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x15,"");
  if ((char **)local_7a0.super_ParserState.prev_cursor_ != ppcVar1) {
    operator_delete(local_7a0.super_ParserState.prev_cursor_,
                    (ulong)(local_7a0.super_ParserState.line_start_ + 1));
  }
  IDLOptions::IDLOptions((IDLOptions *)local_ab0);
  Parser::Parser(&local_7a0,(IDLOptions *)local_ab0);
  IDLOptions::~IDLOptions((IDLOptions *)local_ab0);
  local_ab0._0_8_ = local_ab0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ab0,"include_test","");
  ConCatPathFileName(&local_ae8,tests_data_path,(string *)local_ab0);
  if ((undefined1 *)local_ab0._0_8_ != local_ab0 + 0x10) {
    operator_delete((void *)local_ab0._0_8_,local_ab0._16_8_ + 1);
  }
  local_ac8 = (tests_data_path->_M_dataplus)._M_p;
  local_ac0 = local_ae8._M_dataplus._M_p;
  local_ab8 = 0;
  bVar3 = Parser::Parse(&local_7a0,local_b08._M_dataplus._M_p,&local_ac8,(char *)0x0);
  TestEq<bool,bool>(bVar3,true,
                    "\'parser.Parse(schemafile.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x1d,"");
  local_7a0.opts.output_default_scalars_in_json = true;
  local_7a0.opts.output_enum_identifiers = true;
  local_ab0._0_8_ = (pointer)0x0;
  local_ab0[8] = false;
  local_ab0._16_8_ = 0x400;
  local_ab0._24_4_ = 0x7fffffff;
  local_a90 = 8;
  local_a88._M_allocated_capacity = 0;
  local_a88._8_4_ = 0;
  local_a58 = 0;
  local_a50._0_1_ = false;
  local_a50._1_1_ = false;
  local_a78._M_p = (pointer)0x0;
  uStack_a70 = 0;
  uStack_a6a = 0;
  aStack_a68._M_allocated_capacity._0_6_ = 0;
  aStack_a68._6_8_ = 0;
  local_a48._M_p = (pointer)0x1;
  local_a40._0_1_ = false;
  local_a40._1_1_ = true;
  local_a38[0]._M_allocated_capacity = 0;
  FlatBufferBuilderImpl<false>::CreateStringImpl
            ((FlatBufferBuilderImpl<false> *)local_ab0,"default_enum",0xc);
  off = local_a88._8_4_;
  FlatBufferBuilderImpl<false>::NotNested((FlatBufferBuilderImpl<false> *)local_ab0);
  start = local_a88._8_4_;
  local_a50._0_1_ = true;
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>
            ((FlatBufferBuilderImpl<false> *)local_ab0,10,(Offset<flatbuffers::String>)off);
  table.o = FlatBufferBuilderImpl<false>::EndTable((FlatBufferBuilderImpl<false> *)local_ab0,start);
  FlatBufferBuilderImpl<false>::Required<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)local_ab0,table,10);
  FlatBufferBuilderImpl<false>::Finish
            ((FlatBufferBuilderImpl<false> *)local_ab0,table.o,"MONS",false);
  local_b28._M_string_length = 0;
  local_b28.field_2._M_local_buf[0] = '\0';
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                         ((FlatBufferBuilderImpl<false> *)local_ab0);
  pcVar4 = GenText(&local_7a0,flatbuffer,&local_b28);
  TestEq<bool,bool>(true,pcVar4 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x28,"");
  lVar5 = std::__cxx11::string::find((char *)&local_b28,0x1b87cf,0);
  TestEq<bool,bool>(lVar5 != -1,true,
                    "\'std::string::npos != jsongen.find(\"color: \\\"Blue\\\"\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2a,"");
  lVar5 = std::__cxx11::string::find((char *)&local_b28,0x1b881e,0);
  TestEq<bool,bool>(lVar5 != -1,true,
                    "\'std::string::npos != jsongen.find(\"testf: 3.14159\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/json_test.cpp"
                    ,0x2c,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,
                    CONCAT71(local_b28.field_2._M_allocated_capacity._1_7_,
                             local_b28.field_2._M_local_buf[0]) + 1);
  }
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)local_ab0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  Parser::~Parser(&local_7a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p,
                    CONCAT71(local_b08.field_2._M_allocated_capacity._1_7_,
                             local_b08.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void JsonDefaultTest(const std::string &tests_data_path) {
  // load FlatBuffer schema (.fbs) from disk
  std::string schemafile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.fbs").c_str(),
                                false, &schemafile),
          true);
  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parser;
  auto include_test_path =
      flatbuffers::ConCatPathFileName(tests_data_path, "include_test");
  const char *include_directories[] = { tests_data_path.c_str(),
                                        include_test_path.c_str(), nullptr };

  TEST_EQ(parser.Parse(schemafile.c_str(), include_directories), true);
  // create incomplete monster and store to json
  parser.opts.output_default_scalars_in_json = true;
  parser.opts.output_enum_identifiers = true;
  flatbuffers::FlatBufferBuilder builder;
  auto name = builder.CreateString("default_enum");
  MonsterBuilder color_monster(builder);
  color_monster.add_name(name);
  FinishMonsterBuffer(builder, color_monster.Finish());
  std::string jsongen;
  auto result = GenText(parser, builder.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  // default value of the "color" field is Blue
  TEST_EQ(std::string::npos != jsongen.find("color: \"Blue\""), true);
  // default value of the "testf" field is 3.14159
  TEST_EQ(std::string::npos != jsongen.find("testf: 3.14159"), true);
}